

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

void av1_set_resource_availability_parameters(aom_dec_model_op_parameters_t *op_params)

{
  op_params->decoder_model_param_present_flag = 0;
  op_params->decoder_buffer_delay = 70000;
  op_params->encoder_buffer_delay = 20000;
  op_params->low_delay_mode_flag = 0;
  op_params->display_model_param_present_flag = 1;
  op_params->initial_display_delay = 8;
  return;
}

Assistant:

void av1_set_resource_availability_parameters(
    aom_dec_model_op_parameters_t *op_params) {
  op_params->decoder_model_param_present_flag = 0;
  op_params->decoder_buffer_delay =
      70000;  // Resource availability mode default
  op_params->encoder_buffer_delay =
      20000;                           // Resource availability mode default
  op_params->low_delay_mode_flag = 0;  // Resource availability mode default
  op_params->display_model_param_present_flag = 1;
  op_params->initial_display_delay = 8;  // 8 frames delay
}